

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

bool DoGiveInventory(AActor *receiver,bool orresult,VMValue *param,
                    TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,int numret)

{
  PClassActor *type;
  VMValue *pVVar1;
  AInventory *this;
  bool bVar2;
  bool local_63;
  AInventory *item;
  int setreceiver;
  int amount;
  MetaClass *mi;
  int paramnum;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  AActor *pAStack_18;
  bool orresult_local;
  AActor *receiver_local;
  
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x944,
                  "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
    bVar2 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    type = (PClassActor *)param[1].field_0.field_1.a;
    local_63 = true;
    if (type != (PClassActor *)0x0) {
      local_63 = PClass::IsDescendantOf((PClass *)type,AInventory::RegistrationInfo.MyClass);
    }
    if (local_63 != false) {
      if (numparam < 3) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x945,
                        "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        item._4_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x945,
                        "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        item._4_4_ = param[2].field_0.i;
      }
      pAStack_18 = receiver;
      if (!orresult) {
        if (numparam < 4) {
          pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
          if ((pVVar1->field_0).field_3.Type != '\0') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x949,
                          "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
          item._0_4_ = (pVVar1->field_0).i;
        }
        else {
          if (param[3].field_0.field_3.Type != '\0') {
            __assert_fail("(param[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x949,
                          "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          item._0_4_ = param[3].field_0.i;
        }
        pAStack_18 = COPY_AAPTR(receiver,(int)item);
      }
      if (pAStack_18 == (AActor *)0x0) {
        receiver_local._7_1_ = false;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)pAStack_18,AInventory::RegistrationInfo.MyClass);
        if ((bVar2) &&
           (bVar2 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)(pAStack_18 + 1),(AActor *)0x0),
           bVar2)) {
          receiver_local._7_1_ = false;
        }
        else {
          if (item._4_4_ < 1) {
            item._4_4_ = 1;
          }
          if (type == (PClassActor *)0x0) {
            receiver_local._7_1_ = false;
          }
          else {
            this = (AInventory *)Spawn(type);
            if (this == (AInventory *)0x0) {
              receiver_local._7_1_ = false;
            }
            else {
              bVar2 = DObject::IsKindOf((DObject *)this,AHealth::RegistrationInfo.MyClass);
              if (bVar2) {
                this->Amount = item._4_4_ * this->Amount;
              }
              else {
                this->Amount = item._4_4_;
              }
              TFlags<ActorFlag,_unsigned_int>::operator|=(&(this->super_AActor).flags,MF_DROPPED);
              AActor::ClearCounters((AActor *)this);
              bVar2 = AInventory::CallTryPickup(this,pAStack_18,(AActor **)0x0);
              if (bVar2) {
                receiver_local._7_1_ = true;
              }
              else {
                (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                receiver_local._7_1_ = false;
              }
            }
          }
        }
      }
      return receiver_local._7_1_;
    }
    __assert_fail("mi == NULL || mi->IsDescendantOf(RUNTIME_CLASS(AInventory))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x944,
                  "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x944,
                "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

static bool DoGiveInventory(AActor *receiver, bool orresult, VM_ARGS)
{
	int paramnum = 0;
	PARAM_CLASS		(mi, AInventory);
	PARAM_INT_DEF	(amount)

	if (!orresult)
	{
		PARAM_INT_DEF(setreceiver)
		receiver = COPY_AAPTR(receiver, setreceiver);
	}
	if (receiver == NULL)
	{ // If there's nothing to receive it, it's obviously a fail, right?
		return false;
	}
	// Owned inventory items cannot own anything because their Inventory pointer is repurposed for the owner's linked list.
	if (receiver->IsKindOf(RUNTIME_CLASS(AInventory)) && static_cast<AInventory*>(receiver)->Owner != nullptr)
	{
		return false;
	}

	if (amount <= 0)
	{
		amount = 1;
	}
	if (mi) 
	{
		AInventory *item = static_cast<AInventory *>(Spawn(mi));
		if (item == NULL)
		{
			return false;
		}
		if (item->IsKindOf(RUNTIME_CLASS(AHealth)))
		{
			item->Amount *= amount;
		}
		else
		{
			item->Amount = amount;
		}
		item->flags |= MF_DROPPED;
		item->ClearCounters();
		if (!item->CallTryPickup(receiver))
		{
			item->Destroy();
			return false;
		}
		else
		{
			return true;
		}
	}
	return false;
}